

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

void draw_item_focus(Fl_Boxtype B,Fl_Color fg,Fl_Color bg,int X,int Y,int W,int H)

{
  bool bVar1;
  int iVar2;
  Fl_Color c;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_2c;
  int local_28;
  int yy;
  int xx;
  int i;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Color bg_local;
  Fl_Color fg_local;
  Fl_Boxtype B_local;
  
  iVar2 = Fl::visible_focus();
  if (iVar2 != 0) {
    if ((((B == FL_DOWN_BOX) || (B == FL_DOWN_FRAME)) || (B == FL_THIN_DOWN_BOX)) ||
       (i = Y, W_local = X, B == FL_THIN_DOWN_FRAME)) {
      W_local = X + 1;
      i = Y + 1;
    }
    c = fl_contrast(fg,bg);
    fl_color(c);
    iVar2 = Fl::box_dx(B);
    iVar2 = iVar2 + W_local;
    iVar3 = Fl::box_dy(B);
    iVar3 = iVar3 + i;
    iVar4 = Fl::box_dw(B);
    iVar4 = W - (iVar4 + 2);
    iVar5 = Fl::box_dh(B);
    iVar5 = H - (iVar5 + 2);
    bVar1 = true;
    for (local_28 = 0; local_28 < iVar4; local_28 = local_28 + 1) {
      if (bVar1) {
        fl_point(iVar2 + local_28,iVar3);
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    for (local_2c = 0; local_28 = iVar4, local_2c < iVar5; local_2c = local_2c + 1) {
      if (bVar1) {
        fl_point(iVar2 + iVar4,iVar3 + local_2c);
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    for (; local_2c = iVar5, 0 < local_28; local_28 = local_28 + -1) {
      if (bVar1) {
        fl_point(iVar2 + local_28,iVar3 + iVar5);
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    for (; 0 < local_2c; local_2c = local_2c + -1) {
      if (bVar1) {
        fl_point(iVar2,iVar3 + local_2c);
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  return;
}

Assistant:

static void draw_item_focus(Fl_Boxtype B, Fl_Color fg, Fl_Color bg, int X, int Y, int W, int H) {
  if (!Fl::visible_focus()) return;
  switch (B) {
    case FL_DOWN_BOX:
    case FL_DOWN_FRAME:
    case FL_THIN_DOWN_BOX:
    case FL_THIN_DOWN_FRAME:
      X ++;
      Y ++;
    default:
      break;
  }
  fl_color(fl_contrast(fg, bg));

#if defined(USE_X11) || defined(__APPLE_QUARTZ__)
  fl_line_style(FL_DOT);
  fl_rect(X + Fl::box_dx(B), Y + Fl::box_dy(B),
          W - Fl::box_dw(B) - 1, H - Fl::box_dh(B) - 1);
  fl_line_style(FL_SOLID);
#else
  // Some platforms don't implement dotted line style, so draw
  // every other pixel around the focus area...
  //
  // Also, QuickDraw (MacOS) does not support line styles specifically,
  // and the hack we use in fl_line_style() will not draw horizontal lines
  // on odd-numbered rows...
  int i, xx, yy;

  X += Fl::box_dx(B);
  Y += Fl::box_dy(B);
  W -= Fl::box_dw(B) + 2;
  H -= Fl::box_dh(B) + 2;

  for (xx = 0, i = 1; xx < W; xx ++, i ++) if (i & 1) fl_point(X + xx, Y);
  for (yy = 0; yy < H; yy ++, i ++) if (i & 1) fl_point(X + W, Y + yy);
  for (xx = W; xx > 0; xx --, i ++) if (i & 1) fl_point(X + xx, Y + H);
  for (yy = H; yy > 0; yy --, i ++) if (i & 1) fl_point(X, Y + yy);
#endif
}